

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall
Fluid::draw_particles_ssf
          (Fluid *this,RenderTexture *scene_texture,mat4 *projection,mat4 *view,vec4 *viewport)

{
  GLsizei GVar1;
  PFNGLDRAWARRAYSINSTANCEDPROC p_Var2;
  PFNGLUNIFORM1IPROC p_Var3;
  PFNGLUNIFORM2IVPROC p_Var4;
  PFNGLUNIFORM3FVPROC p_Var5;
  PFNGLUNIFORM4FVPROC p_Var6;
  PFNGLUNIFORMMATRIX4FVPROC p_Var7;
  GLint GVar8;
  int iVar9;
  float *pfVar10;
  int *piVar11;
  socklen_t __len;
  PFNGLUNIFORM3FVPROC p_Var12;
  sockaddr *__addr;
  mat<4,_4,_float,_(glm::qualifier)0> *m;
  Program *this_00;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  mat<4,_4,_float,_(glm::qualifier)0> local_20c;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  vec4 *local_30;
  vec4 *viewport_local;
  mat4 *view_local;
  mat4 *projection_local;
  RenderTexture *scene_texture_local;
  Fluid *this_local;
  
  this_00 = &this->ssf_spheres_program;
  local_30 = viewport;
  viewport_local = view->value;
  view_local = projection;
  projection_local = (mat4 *)scene_texture;
  scene_texture_local = (RenderTexture *)this;
  gfx::Program::use(this_00);
  set_common_uniforms(this,this_00);
  p_Var7 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"projection",&local_51);
  GVar8 = gfx::Program::uniform_loc(this_00,&local_50);
  pfVar10 = glm::value_ptr<float,(glm::qualifier)0>(view_local);
  (*p_Var7)(GVar8,1,'\0',pfVar10);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  p_Var7 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"view",&local_89);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_spheres_program,&local_88);
  pfVar10 = glm::value_ptr<float,(glm::qualifier)0>
                      ((mat<4,_4,_float,_(glm::qualifier)0> *)viewport_local);
  (*p_Var7)(GVar8,1,'\0',pfVar10);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  p_Var6 = glad_glUniform4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"viewport",&local_b1);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_spheres_program,&local_b0);
  pfVar10 = glm::value_ptr<float,(glm::qualifier)0>(local_30);
  (*p_Var6)(GVar8,1,pfVar10);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  p_Var5 = glad_glUniform3fv;
  p_Var12 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  __len = (socklen_t)p_Var12;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"look",&local_d9);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_spheres_program,&local_d8);
  pfVar10 = glm::value_ptr<float,(glm::qualifier)0>(&this->look);
  iVar9 = 1;
  (*p_Var5)(GVar8,1,pfVar10);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  gfx::VAO::bind(&this->vao,iVar9,__addr,__len);
  SSFRenderTexture::bind_framebuffer(&this->ssf_a_texture);
  (*glad_glDrawBuffers)(2,draw_particles_ssf::ssf_draw_buffers);
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  (*glad_glClear)(0x4100);
  (*glad_glEnable)(0xbe2);
  (*glad_glDisable)(0xb71);
  (*glad_glBlendFunc)(1,1);
  p_Var3 = glad_glUniform1i;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"pass",&local_101);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_spheres_program,&local_100);
  (*p_Var3)(GVar8,0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  (*glad_glDrawBuffers)(2,draw_particles_ssf::first_pass_buffers);
  p_Var2 = glad_glDrawArraysInstanced;
  GVar1 = this->num_circle_vertices;
  iVar9 = gfx::Buffer::length(&this->particle_ssbo);
  (*p_Var2)(6,0,GVar1,iVar9);
  (*glad_glDisable)(0xbe2);
  (*glad_glEnable)(0xb71);
  p_Var3 = glad_glUniform1i;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"pass",&local_129);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_spheres_program,&local_128);
  (*p_Var3)(GVar8,1);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  (*glad_glDrawBuffers)(2,draw_particles_ssf::second_pass_buffers);
  p_Var2 = glad_glDrawArraysInstanced;
  GVar1 = this->num_circle_vertices;
  iVar9 = gfx::Buffer::length(&this->particle_ssbo);
  (*p_Var2)(6,0,GVar1,iVar9);
  SSFRenderTexture::unbind_framebuffer(&this->ssf_a_texture);
  gfx::VAO::unbind(&this->vao);
  gfx::Program::disuse(&this->ssf_spheres_program);
  (*glad_glDisable)(0xbe2);
  gfx::Program::use(&this->ssf_smooth_program);
  p_Var4 = glad_glUniform2iv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"resolution",&local_151);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_smooth_program,&local_150);
  piVar11 = glm::value_ptr<int,(glm::qualifier)0>(&this->resolution);
  (*p_Var4)(GVar8,1,piVar11);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,(this->ssf_a_texture).color1_id);
  SSFRenderTexture::bind_framebuffer(&this->ssf_b_texture);
  (*glad_glDrawBuffers)(2,draw_particles_ssf::ssf_draw_buffers);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  (*glad_glClear)(0x4100);
  Quad::draw(&this->quad);
  SSFRenderTexture::unbind_framebuffer(&this->ssf_b_texture);
  (*glad_glBindTexture)(0xde1,0);
  gfx::Program::disuse(&this->ssf_smooth_program);
  gfx::Program::use(&this->ssf_shade_program);
  p_Var4 = glad_glUniform2iv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"resolution",&local_179);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_shade_program,&local_178);
  piVar11 = glm::value_ptr<int,(glm::qualifier)0>(&this->resolution);
  (*p_Var4)(GVar8,1,piVar11);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  p_Var7 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"projection",&local_1a1);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_shade_program,&local_1a0);
  pfVar10 = glm::value_ptr<float,(glm::qualifier)0>(view_local);
  (*p_Var7)(GVar8,1,'\0',pfVar10);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  p_Var7 = glad_glUniformMatrix4fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"inv_view",&local_1c9);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_shade_program,&local_1c8);
  glm::inverse<4,4,float,(glm::qualifier)0>(&local_20c,(glm *)viewport_local,m);
  pfVar10 = glm::value_ptr<float,(glm::qualifier)0>(&local_20c);
  (*p_Var7)(GVar8,1,'\0',pfVar10);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  p_Var5 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"look",&local_231);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_shade_program,&local_230);
  pfVar10 = glm::value_ptr<float,(glm::qualifier)0>(&this->look);
  (*p_Var5)(GVar8,1,pfVar10);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  p_Var5 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"eye",&local_259);
  GVar8 = gfx::Program::uniform_loc(&this->ssf_shade_program,&local_258);
  pfVar10 = glm::value_ptr<float,(glm::qualifier)0>(&this->eye);
  (*p_Var5)(GVar8,1,pfVar10);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,(this->ssf_a_texture).color_id);
  (*glad_glActiveTexture)(0x84c1);
  (*glad_glBindTexture)(0xde1,(this->ssf_a_texture).depth_id);
  (*glad_glActiveTexture)(0x84c2);
  (*glad_glBindTexture)(0xde1,(this->ssf_b_texture).color1_id);
  (*glad_glActiveTexture)(0x84c3);
  (*glad_glBindTexture)(0xde1,(GLuint)projection_local->value[0].field_3);
  Quad::draw(&this->quad);
  (*glad_glBindTexture)(0xde1,0);
  gfx::Program::disuse(&this->ssf_shade_program);
  return;
}

Assistant:

void draw_particles_ssf(const gfx::RenderTexture& scene_texture, const glm::mat4& projection, const glm::mat4& view, const glm::vec4& viewport) {
        constexpr static GLenum ssf_draw_buffers[]{GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1};

        // render spheres and position data
        ssf_spheres_program.use();
            set_common_uniforms(ssf_spheres_program);
            glUniformMatrix4fv(ssf_spheres_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
            glUniformMatrix4fv(ssf_spheres_program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
            glUniform4fv(ssf_spheres_program.uniform_loc("viewport"), 1, glm::value_ptr(viewport));
            glUniform3fv(ssf_spheres_program.uniform_loc("look"), 1, glm::value_ptr(look));

            vao.bind();
            ssf_a_texture.bind_framebuffer();

            // clear buffers
            glDrawBuffers(2, ssf_draw_buffers);
            glClearColor(0, 0, 0, 0);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

            // color pass
            glEnable(GL_BLEND);
            glDisable(GL_DEPTH_TEST);
            glBlendFunc(GL_ONE, GL_ONE);
            glUniform1i(ssf_spheres_program.uniform_loc("pass"), 0);
            constexpr static GLenum first_pass_buffers[]{GL_COLOR_ATTACHMENT0, GL_NONE};
            glDrawBuffers(2, first_pass_buffers);
            glDrawArraysInstanced(GL_TRIANGLE_FAN, 0, num_circle_vertices, particle_ssbo.length());

            // sphere position pass
            glDisable(GL_BLEND);
            glEnable(GL_DEPTH_TEST);
            glUniform1i(ssf_spheres_program.uniform_loc("pass"), 1);
            constexpr static GLenum second_pass_buffers[]{GL_NONE, GL_COLOR_ATTACHMENT1};
            glDrawBuffers(2, second_pass_buffers);
            glDrawArraysInstanced(GL_TRIANGLE_FAN, 0, num_circle_vertices, particle_ssbo.length());
            
            ssf_a_texture.unbind_framebuffer();
            vao.unbind();
        ssf_spheres_program.disuse();

        // smooth sphere depths, do color thing
        glDisable(GL_BLEND);
        ssf_smooth_program.use();
            glUniform2iv(ssf_smooth_program.uniform_loc("resolution"), 1, glm::value_ptr(resolution));
            glActiveTexture(GL_TEXTURE0);
            glBindTexture(GL_TEXTURE_2D, ssf_a_texture.color1_id);
            ssf_b_texture.bind_framebuffer();
            glDrawBuffers(2, ssf_draw_buffers);
            glClearColor(0, 0, 0, 1);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            quad.draw();
            ssf_b_texture.unbind_framebuffer();
            glBindTexture(GL_TEXTURE_2D, 0);
        ssf_smooth_program.disuse();

        // shade fluid
        // glDisable(GL_DEPTH_TEST);
        ssf_shade_program.use();
            glUniform2iv(ssf_shade_program.uniform_loc("resolution"), 1, glm::value_ptr(resolution));
            glUniformMatrix4fv(ssf_shade_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
            glUniformMatrix4fv(ssf_shade_program.uniform_loc("inv_view"), 1, GL_FALSE, glm::value_ptr(glm::inverse(view)));
            glUniform3fv(ssf_shade_program.uniform_loc("look"), 1, glm::value_ptr(look));
            glUniform3fv(ssf_shade_program.uniform_loc("eye"), 1, glm::value_ptr(eye));
            glActiveTexture(GL_TEXTURE0);
            glBindTexture(GL_TEXTURE_2D, ssf_a_texture.color_id);
            glActiveTexture(GL_TEXTURE1);
            glBindTexture(GL_TEXTURE_2D, ssf_a_texture.depth_id);
            glActiveTexture(GL_TEXTURE2);
            glBindTexture(GL_TEXTURE_2D, ssf_b_texture.color1_id); // sphere position data
            glActiveTexture(GL_TEXTURE3);
            glBindTexture(GL_TEXTURE_2D, scene_texture.color_id);
            quad.draw();
            glBindTexture(GL_TEXTURE_2D, 0);
        ssf_shade_program.disuse();
    }